

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O2

void al_unregister_event_source(ALLEGRO_EVENT_QUEUE *queue,ALLEGRO_EVENT_SOURCE *source)

{
  _AL_VECTOR *vec;
  ALLEGRO_EVENT_SOURCE *pAVar1;
  int iVar2;
  _Bool _Var3;
  void *pvVar4;
  ALLEGRO_EVENT *event;
  undefined8 *puVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  _AL_MUTEX *m;
  byte bVar10;
  ALLEGRO_EVENT_SOURCE *source_local;
  _AL_MUTEX *local_60;
  _AL_VECTOR local_58;
  
  bVar10 = 0;
  m = &queue->mutex;
  source_local = source;
  _al_mutex_lock(m);
  _Var3 = _al_vector_find_and_delete(&queue->sources,&source_local);
  _al_mutex_unlock(m);
  if (!_Var3) {
    return;
  }
  _al_event_source_on_unregistration_from_queue(source_local,queue);
  _al_mutex_lock(m);
  pAVar1 = source_local;
  uVar8 = (ulong)queue->events_tail;
  vec = &queue->events;
  while( true ) {
    uVar9 = (uint)uVar8;
    if (uVar9 == queue->events_head) goto LAB_001585e8;
    pvVar4 = _al_vector_ref(vec,uVar9);
    if (*(ALLEGRO_EVENT_SOURCE **)((long)pvVar4 + 8) == pAVar1) break;
    uVar8 = (ulong)(uVar9 + 1) % (queue->events)._size;
  }
  local_58._itemsize = vec->_itemsize;
  local_58._items = (queue->events)._items;
  local_58._size = (queue->events)._size;
  local_58._unused = (queue->events)._unused;
  local_60 = m;
  _al_vector_init(vec,0x48);
  uVar8 = (ulong)queue->events_tail;
  while (m = local_60, uVar9 = (uint)uVar8, uVar9 != queue->events_head) {
    event = (ALLEGRO_EVENT *)_al_vector_ref(&local_58,uVar9);
    if ((event->any).source == pAVar1) {
      unref_if_user_event(event);
    }
    else {
      puVar5 = (undefined8 *)_al_vector_alloc_back(vec);
      for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
        *puVar5 = *(undefined8 *)event;
        event = (ALLEGRO_EVENT *)((long)event + (ulong)bVar10 * -0x10 + 8);
        puVar5 = puVar5 + (ulong)bVar10 * -2 + 1;
      }
    }
    uVar8 = (ulong)(uVar9 + 1) % local_58._size;
  }
  queue->events_tail = 0;
  uVar9 = (uint)(queue->events)._size;
  queue->events_head = uVar9;
  iVar2 = 1;
  do {
    iVar7 = iVar2;
    iVar2 = iVar7 * 2;
  } while (iVar7 < (int)(uVar9 + 1));
  for (; (ulong)uVar9 < (ulong)(long)iVar7; uVar9 = uVar9 + 1) {
    _al_vector_alloc_back(vec);
  }
  _al_vector_free(&local_58);
LAB_001585e8:
  _al_mutex_unlock(m);
  return;
}

Assistant:

void al_unregister_event_source(ALLEGRO_EVENT_QUEUE *queue,
   ALLEGRO_EVENT_SOURCE *source)
{
   bool found;
   ASSERT(queue);
   ASSERT(source);

   /* Remove source from our list. */
   _al_mutex_lock(&queue->mutex);
   found = _al_vector_find_and_delete(&queue->sources, &source);
   _al_mutex_unlock(&queue->mutex);

   if (found) {
      /* Tell the event source that it was unregistered. */
      _al_event_source_on_unregistration_from_queue(source, queue);

      /* Drop all the events in the queue that belonged to the source. */
      _al_mutex_lock(&queue->mutex);
      discard_events_of_source(queue, source);
      _al_mutex_unlock(&queue->mutex);
   }
}